

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::TreeEnsembleRegressor::ByteSizeLong(TreeEnsembleRegressor *this)

{
  size_t sVar1;
  size_t sVar2;
  
  if (this->treeensemble_ == (TreeEnsembleParameters *)0x0 ||
      this == (TreeEnsembleRegressor *)&_TreeEnsembleRegressor_default_instance_) {
    sVar1 = 0;
  }
  else {
    sVar1 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::TreeEnsembleParameters>(this->treeensemble_)
    ;
    sVar1 = sVar1 + 1;
  }
  if (this->postevaluationtransform_ != 0) {
    sVar2 = google::protobuf::io::CodedOutputStream::VarintSize32SignExtended
                      (this->postevaluationtransform_);
    sVar1 = sVar1 + sVar2 + 1;
  }
  this->_cached_size_ = (int)sVar1;
  return sVar1;
}

Assistant:

size_t TreeEnsembleRegressor::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.TreeEnsembleRegressor)
  size_t total_size = 0;

  // .CoreML.Specification.TreeEnsembleParameters treeEnsemble = 1;
  if (this->has_treeensemble()) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
        *this->treeensemble_);
  }

  // .CoreML.Specification.TreeEnsemblePostEvaluationTransform postEvaluationTransform = 2;
  if (this->postevaluationtransform() != 0) {
    total_size += 1 +
      ::google::protobuf::internal::WireFormatLite::EnumSize(this->postevaluationtransform());
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}